

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O0

bool __thiscall
binlog::SessionWriter::addEvent<std::vector<int,std::allocator<int>>>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,
          vector<int,_std::allocator<int>_> *args)

{
  undefined1 uVar1;
  bool bVar2;
  QueueWriter *in_RDI;
  size_t in_stack_00000030;
  SessionWriter *in_stack_00000038;
  size_t totalSize;
  size_t s;
  size_t *__end0;
  size_t *__begin0;
  size_t (*__range2) [3];
  size_t sizes [3];
  size_t size;
  QueueWriter *in_stack_ffffffffffffff38;
  unsigned_long *in_stack_ffffffffffffff40;
  vector<int,_std::allocator<int>_> *in;
  undefined6 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  undefined1 local_74 [28];
  long *local_58;
  long *local_50;
  long local_48 [3];
  long local_30 [6];
  
  local_30[0] = 0;
  local_48[0] = 8;
  local_48[1] = 8;
  local_48[2] = mserialize::serialized_size<std::vector<int,std::allocator<int>>>
                          ((vector<int,_std::allocator<int>_> *)0x222642);
  local_74._20_8_ = local_30;
  local_50 = local_48;
  for (local_58 = local_50; local_58 != (long *)local_74._20_8_; local_58 = local_58 + 1) {
    local_74._12_8_ = *local_58;
    local_30[0] = local_74._12_8_ + local_30[0];
  }
  local_74._4_8_ = local_30[0] + 4;
  uVar1 = detail::QueueWriter::beginWrite
                    (in_RDI,CONCAT17(in_stack_ffffffffffffff5f,
                                     CONCAT16(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58)))
  ;
  if (!(bool)uVar1) {
    replaceChannel(in_stack_00000038,in_stack_00000030);
    bVar2 = detail::QueueWriter::beginWrite
                      (in_RDI,CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff5e,
                                                      in_stack_ffffffffffffff58)));
    if (!bVar2) {
      return false;
    }
  }
  mserialize::serialize<unsigned_int,binlog::detail::QueueWriter>
            ((uint *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  mserialize::serialize<unsigned_long,binlog::detail::QueueWriter>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  mserialize::serialize<unsigned_long,binlog::detail::QueueWriter>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  in = (vector<int,_std::allocator<int>_> *)local_74;
  mserialize::serialize<std::vector<int,std::allocator<int>>,binlog::detail::QueueWriter>
            (in,in_stack_ffffffffffffff38);
  *(undefined4 *)
   &(in->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start = 0
  ;
  detail::QueueWriter::endWrite(in_RDI);
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}